

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O0

void noises(monst *magr,attack *mattk)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  boolean farq;
  attack *mattk_local;
  monst *magr_local;
  
  iVar2 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy);
  bVar1 = 0xf < iVar2;
  if ((flags.soundok != '\0') &&
     ((bVar1 != (bool)far_noise || (10 < (long)((ulong)moves - noisetime))))) {
    noisetime = (long)moves;
    pcVar4 = "some noises";
    if (mattk->aatyp == '\r') {
      pcVar4 = "an explosion";
    }
    pcVar3 = "";
    if (bVar1) {
      pcVar3 = " in the distance";
    }
    far_noise = bVar1;
    You_hear("%s%s.",pcVar4,pcVar3);
  }
  return;
}

Assistant:

static void noises(struct monst *magr, const struct attack *mattk)
{
	boolean farq = (distu(magr->mx, magr->my) > 15);

	if (flags.soundok && (farq != far_noise || moves-noisetime > 10)) {
		far_noise = farq;
		noisetime = moves;
		You_hear("%s%s.",
			(mattk->aatyp == AT_EXPL) ? "an explosion" : "some noises",
			farq ? " in the distance" : "");
	}
}